

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

bool __thiscall
cmFileCommand::HandleRPathChangeCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  cmMakefile *this_00;
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  ostream *poVar4;
  cmSystemToolsFileTime *t;
  char *message_00;
  allocator local_669;
  string local_668 [8];
  string message;
  undefined1 local_628 [8];
  ostringstream e_2;
  allocator local_4a9;
  string local_4a8;
  allocator local_481;
  string local_480;
  allocator local_459;
  string local_458;
  bool local_431;
  undefined1 local_430 [7];
  bool changed;
  string emsg;
  bool have_ft;
  cmSystemToolsFileTime *ft;
  undefined1 local_3f8 [7];
  bool success;
  ostringstream local_3d8 [8];
  ostringstream e_1;
  allocator local_259;
  string local_258;
  allocator local_231;
  string local_230;
  allocator local_209;
  string local_208;
  string local_1e8;
  ostringstream local_1b8 [8];
  ostringstream e;
  uint local_40;
  int local_3c;
  uint i;
  Doing doing;
  char *newRPath;
  char *oldRPath;
  char *file;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmFileCommand *this_local;
  
  oldRPath = (char *)0x0;
  newRPath = (char *)0x0;
  _i = (char *)0x0;
  local_3c = 0;
  local_40 = 1;
  do {
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(args);
    if (sVar2 <= local_40) {
      if (oldRPath == (char *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_208,"RPATH_CHANGE not given FILE option.",&local_209);
        cmCommand::SetError(&this->super_cmCommand,&local_208);
        std::__cxx11::string::~string((string *)&local_208);
        std::allocator<char>::~allocator((allocator<char> *)&local_209);
        this_local._7_1_ = false;
      }
      else if (newRPath == (char *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_230,"RPATH_CHANGE not given OLD_RPATH option.",&local_231);
        cmCommand::SetError(&this->super_cmCommand,&local_230);
        std::__cxx11::string::~string((string *)&local_230);
        std::allocator<char>::~allocator((allocator<char> *)&local_231);
        this_local._7_1_ = false;
      }
      else if (_i == (char *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_258,"RPATH_CHANGE not given NEW_RPATH option.",&local_259);
        cmCommand::SetError(&this->super_cmCommand,&local_258);
        std::__cxx11::string::~string((string *)&local_258);
        std::allocator<char>::~allocator((allocator<char> *)&local_259);
        this_local._7_1_ = false;
      }
      else {
        bVar1 = cmsys::SystemTools::FileExists(oldRPath,true);
        if (bVar1) {
          t = cmSystemTools::FileTimeNew();
          emsg.field_2._M_local_buf[0xf] = cmSystemTools::FileTimeGet(oldRPath,t);
          std::__cxx11::string::string((string *)local_430);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_458,oldRPath,&local_459);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_480,newRPath,&local_481);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_4a8,_i,&local_4a9);
          bVar1 = cmSystemTools::ChangeRPath
                            (&local_458,&local_480,&local_4a8,(string *)local_430,&local_431);
          std::__cxx11::string::~string((string *)&local_4a8);
          std::allocator<char>::~allocator((allocator<char> *)&local_4a9);
          std::__cxx11::string::~string((string *)&local_480);
          std::allocator<char>::~allocator((allocator<char> *)&local_481);
          std::__cxx11::string::~string((string *)&local_458);
          std::allocator<char>::~allocator((allocator<char> *)&local_459);
          bVar1 = ((bVar1 ^ 0xffU) & 1) != 0;
          if (bVar1) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_628);
            poVar4 = std::operator<<((ostream *)local_628,
                                     "RPATH_CHANGE could not write new RPATH:\n");
            poVar4 = std::operator<<(poVar4,"  ");
            poVar4 = std::operator<<(poVar4,_i);
            poVar4 = std::operator<<(poVar4,"\n");
            poVar4 = std::operator<<(poVar4,"to the file:\n");
            poVar4 = std::operator<<(poVar4,"  ");
            poVar4 = std::operator<<(poVar4,oldRPath);
            poVar4 = std::operator<<(poVar4,"\n");
            std::operator<<(poVar4,(string *)local_430);
            std::__cxx11::ostringstream::str();
            cmCommand::SetError(&this->super_cmCommand,(string *)((long)&message.field_2 + 8));
            std::__cxx11::string::~string((string *)(message.field_2._M_local_buf + 8));
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_628);
          }
          ft._7_1_ = !bVar1;
          if (ft._7_1_) {
            if ((local_431 & 1U) != 0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_668,"Set runtime path of \"",&local_669);
              std::allocator<char>::~allocator((allocator<char> *)&local_669);
              std::__cxx11::string::operator+=(local_668,oldRPath);
              std::__cxx11::string::operator+=(local_668,"\" to \"");
              std::__cxx11::string::operator+=(local_668,_i);
              std::__cxx11::string::operator+=(local_668,"\"");
              this_00 = (this->super_cmCommand).Makefile;
              message_00 = (char *)std::__cxx11::string::c_str();
              cmMakefile::DisplayStatus(this_00,message_00,-1.0);
              std::__cxx11::string::~string(local_668);
            }
            if ((emsg.field_2._M_local_buf[0xf] & 1U) != 0) {
              cmSystemTools::FileTimeSet(oldRPath,t);
            }
          }
          cmSystemTools::FileTimeDelete(t);
          this_local._7_1_ = ft._7_1_;
          std::__cxx11::string::~string((string *)local_430);
        }
        else {
          std::__cxx11::ostringstream::ostringstream(local_3d8);
          poVar4 = std::operator<<((ostream *)local_3d8,"RPATH_CHANGE given FILE \"");
          poVar4 = std::operator<<(poVar4,oldRPath);
          std::operator<<(poVar4,"\" that does not exist.");
          std::__cxx11::ostringstream::str();
          cmCommand::SetError(&this->super_cmCommand,(string *)local_3f8);
          std::__cxx11::string::~string((string *)local_3f8);
          this_local._7_1_ = false;
          std::__cxx11::ostringstream::~ostringstream(local_3d8);
        }
      }
      return this_local._7_1_;
    }
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](args,(ulong)local_40);
    bVar1 = std::operator==(pvVar3,"OLD_RPATH");
    if (bVar1) {
      local_3c = 2;
    }
    else {
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](args,(ulong)local_40);
      bVar1 = std::operator==(pvVar3,"NEW_RPATH");
      if (bVar1) {
        local_3c = 3;
      }
      else {
        pvVar3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](args,(ulong)local_40);
        bVar1 = std::operator==(pvVar3,"FILE");
        if (bVar1) {
          local_3c = 1;
        }
        else {
          if (local_3c == 1) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](args,(ulong)local_40);
            oldRPath = (char *)std::__cxx11::string::c_str();
          }
          else if (local_3c == 2) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](args,(ulong)local_40);
            newRPath = (char *)std::__cxx11::string::c_str();
          }
          else {
            if (local_3c != 3) {
              std::__cxx11::ostringstream::ostringstream(local_1b8);
              poVar4 = std::operator<<((ostream *)local_1b8,"RPATH_CHANGE given unknown argument ");
              pvVar3 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[](args,(ulong)local_40);
              std::operator<<(poVar4,(string *)pvVar3);
              std::__cxx11::ostringstream::str();
              cmCommand::SetError(&this->super_cmCommand,&local_1e8);
              std::__cxx11::string::~string((string *)&local_1e8);
              std::__cxx11::ostringstream::~ostringstream(local_1b8);
              return false;
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](args,(ulong)local_40);
            _i = (char *)std::__cxx11::string::c_str();
          }
          local_3c = 0;
        }
      }
    }
    local_40 = local_40 + 1;
  } while( true );
}

Assistant:

bool
cmFileCommand::HandleRPathChangeCommand(std::vector<std::string> const& args)
{
  // Evaluate arguments.
  const char* file = 0;
  const char* oldRPath = 0;
  const char* newRPath = 0;
  enum Doing { DoingNone, DoingFile, DoingOld, DoingNew };
  Doing doing = DoingNone;
  for(unsigned int i=1; i < args.size(); ++i)
    {
    if(args[i] == "OLD_RPATH")
      {
      doing = DoingOld;
      }
    else if(args[i] == "NEW_RPATH")
      {
      doing = DoingNew;
      }
    else if(args[i] == "FILE")
      {
      doing = DoingFile;
      }
    else if(doing == DoingFile)
      {
      file = args[i].c_str();
      doing = DoingNone;
      }
    else if(doing == DoingOld)
      {
      oldRPath = args[i].c_str();
      doing = DoingNone;
      }
    else if(doing == DoingNew)
      {
      newRPath = args[i].c_str();
      doing = DoingNone;
      }
    else
      {
      std::ostringstream e;
      e << "RPATH_CHANGE given unknown argument " << args[i];
      this->SetError(e.str());
      return false;
      }
    }
  if(!file)
    {
    this->SetError("RPATH_CHANGE not given FILE option.");
    return false;
    }
  if(!oldRPath)
    {
    this->SetError("RPATH_CHANGE not given OLD_RPATH option.");
    return false;
    }
  if(!newRPath)
    {
    this->SetError("RPATH_CHANGE not given NEW_RPATH option.");
    return false;
    }
  if(!cmSystemTools::FileExists(file, true))
    {
    std::ostringstream e;
    e << "RPATH_CHANGE given FILE \"" << file << "\" that does not exist.";
    this->SetError(e.str());
    return false;
    }
  bool success = true;
  cmSystemToolsFileTime* ft = cmSystemTools::FileTimeNew();
  bool have_ft = cmSystemTools::FileTimeGet(file, ft);
  std::string emsg;
  bool changed;
  if(!cmSystemTools::ChangeRPath(file, oldRPath, newRPath, &emsg, &changed))
    {
    std::ostringstream e;
    e << "RPATH_CHANGE could not write new RPATH:\n"
      << "  " << newRPath << "\n"
      << "to the file:\n"
      << "  " << file << "\n"
      << emsg;
    this->SetError(e.str());
    success = false;
    }
  if(success)
    {
    if(changed)
      {
      std::string message = "Set runtime path of \"";
      message += file;
      message += "\" to \"";
      message += newRPath;
      message += "\"";
      this->Makefile->DisplayStatus(message.c_str(), -1);
      }
    if(have_ft)
      {
      cmSystemTools::FileTimeSet(file, ft);
      }
    }
  cmSystemTools::FileTimeDelete(ft);
  return success;
}